

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O0

Result __thiscall wabt::TypeChecker::OnSelect(TypeChecker *this)

{
  Result RVar1;
  Type local_1c;
  TypeChecker *pTStack_18;
  Type type;
  TypeChecker *this_local;
  Result result;
  
  pTStack_18 = this;
  Result::Result((Result *)((long)&this_local + 4),Ok);
  local_1c = Any;
  RVar1 = PeekAndCheckType(this,0,I32);
  Result::operator|=((Result *)((long)&this_local + 4),RVar1);
  RVar1 = PeekType(this,1,&local_1c);
  Result::operator|=((Result *)((long)&this_local + 4),RVar1);
  RVar1 = PeekAndCheckType(this,2,local_1c);
  Result::operator|=((Result *)((long)&this_local + 4),RVar1);
  PrintStackIfFailed<wabt::Type,wabt::Type,wabt::Type>
            (this,this_local._4_4_,"select",I32,local_1c,local_1c);
  RVar1 = DropTypes(this,3);
  Result::operator|=((Result *)((long)&this_local + 4),RVar1);
  PushType(this,local_1c);
  return (Result)this_local._4_4_;
}

Assistant:

Result TypeChecker::OnSelect() {
  Result result = Result::Ok;
  Type type = Type::Any;
  result |= PeekAndCheckType(0, Type::I32);
  result |= PeekType(1, &type);
  result |= PeekAndCheckType(2, type);
  PrintStackIfFailed(result, "select", Type::I32, type, type);
  result |= DropTypes(3);
  PushType(type);
  return result;
}